

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

string * __thiscall
Command::commandWithoutDefaultArgs(string *__return_storage_ptr__,Command *this,string *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,&this->cmd_," ");
  std::operator+(__return_storage_ptr__,&bStack_38,args);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
            (&bStack_38);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string
  commandWithoutDefaultArgs(const std::string &args) const {
    return cmd_ + " " + args;
  }